

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

string * __thiscall cmMakefile::GetSafeDefinition(cmMakefile *this,string *name)

{
  int iVar1;
  string *def;
  string *name_local;
  cmMakefile *this_local;
  
  if ((GetSafeDefinition(std::__cxx11::string_const&)::empty_abi_cxx11_ == '\0') &&
     (iVar1 = __cxa_guard_acquire(&GetSafeDefinition(std::__cxx11::string_const&)::empty_abi_cxx11_)
     , iVar1 != 0)) {
    std::__cxx11::string::string
              ((string *)&GetSafeDefinition(std::__cxx11::string_const&)::empty_abi_cxx11_);
    __cxa_atexit(std::__cxx11::string::~string,
                 &GetSafeDefinition(std::__cxx11::string_const&)::empty_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&GetSafeDefinition(std::__cxx11::string_const&)::empty_abi_cxx11_);
  }
  this_local = (cmMakefile *)GetDef(this,name);
  if (this_local == (cmMakefile *)0x0) {
    this_local = (cmMakefile *)&GetSafeDefinition(std::__cxx11::string_const&)::empty_abi_cxx11_;
  }
  return (string *)this_local;
}

Assistant:

const std::string& cmMakefile::GetSafeDefinition(const std::string& name) const
{
  static std::string const empty;
  const std::string* def = GetDef(name);
  if (!def) {
    return empty;
  }
  return *def;
}